

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O0

void initBuf(uchar *buf,int w,int h,int pf,int flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 uVar6;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  uint in_R8D;
  int halfway;
  int col;
  int row;
  int index;
  int ps;
  int boffset;
  int goffset;
  int roffset;
  int local_34;
  int local_30;
  int local_2c;
  
  iVar1 = tjRedOffset[in_ECX];
  iVar2 = tjGreenOffset[in_ECX];
  iVar3 = tjBlueOffset[in_ECX];
  iVar4 = tjPixelSize[in_ECX];
  if (in_ECX == 6) {
    memset(in_RDI,0,(long)(in_ESI * in_EDX * iVar4));
    for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
        iVar1 = local_30;
        if ((in_R8D & 2) != 0) {
          iVar1 = (in_EDX - local_30) + -1;
        }
        local_2c = iVar1 * in_ESI + local_34;
        if ((local_30 / 8 + local_34 / 8) % 2 == 0) {
          uVar6 = 0;
          if (local_30 < 0x10) {
            uVar6 = 0xff;
          }
          *(undefined1 *)((long)in_RDI + (long)local_2c) = uVar6;
        }
        else {
          uVar6 = 0xe2;
          if (local_30 < 0x10) {
            uVar6 = 0x4c;
          }
          *(undefined1 *)((long)in_RDI + (long)local_2c) = uVar6;
        }
      }
    }
  }
  else if (in_ECX == 0xb) {
    memset(in_RDI,0xff,(long)(in_ESI * in_EDX * iVar4));
    for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
        iVar1 = local_30;
        if ((in_R8D & 2) != 0) {
          iVar1 = (in_EDX - local_30) + -1;
        }
        local_2c = iVar1 * in_ESI + local_34;
        if ((local_30 / 8 + local_34 / 8) % 2 == 0) {
          if (0xf < local_30) {
            *(undefined1 *)((long)in_RDI + (long)(local_2c * iVar4 + 3)) = 0;
          }
        }
        else {
          *(undefined1 *)((long)in_RDI + (long)(local_2c * iVar4 + 2)) = 0;
          if (local_30 < 0x10) {
            *(undefined1 *)((long)in_RDI + (long)(local_2c * iVar4 + 1)) = 0;
          }
        }
      }
    }
  }
  else {
    memset(in_RDI,0,(long)(in_ESI * in_EDX * iVar4));
    for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
        iVar5 = local_30;
        if ((in_R8D & 2) != 0) {
          iVar5 = (in_EDX - local_30) + -1;
        }
        local_2c = iVar5 * in_ESI + local_34;
        if ((local_30 / 8 + local_34 / 8) % 2 == 0) {
          if (local_30 < 0x10) {
            *(undefined1 *)((long)in_RDI + (long)(local_2c * iVar4 + iVar1)) = 0xff;
            *(undefined1 *)((long)in_RDI + (long)(local_2c * iVar4 + iVar2)) = 0xff;
            *(undefined1 *)((long)in_RDI + (long)(local_2c * iVar4 + iVar3)) = 0xff;
          }
        }
        else {
          *(undefined1 *)((long)in_RDI + (long)(local_2c * iVar4 + iVar1)) = 0xff;
          if (0xf < local_30) {
            *(undefined1 *)((long)in_RDI + (long)(local_2c * iVar4 + iVar2)) = 0xff;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void initBuf(unsigned char *buf, int w, int h, int pf, int flags)
{
  int roffset = tjRedOffset[pf];
  int goffset = tjGreenOffset[pf];
  int boffset = tjBlueOffset[pf];
  int ps = tjPixelSize[pf];
  int index, row, col, halfway = 16;

  if (pf == TJPF_GRAY) {
    memset(buf, 0, w * h * ps);
    for (row = 0; row < h; row++) {
      for (col = 0; col < w; col++) {
        if (flags & TJFLAG_BOTTOMUP) index = (h - row - 1) * w + col;
        else index = row * w + col;
        if (((row / 8) + (col / 8)) % 2 == 0)
          buf[index] = (row < halfway) ? 255 : 0;
        else buf[index] = (row < halfway) ? 76 : 226;
      }
    }
  } else if (pf == TJPF_CMYK) {
    memset(buf, 255, w * h * ps);
    for (row = 0; row < h; row++) {
      for (col = 0; col < w; col++) {
        if (flags & TJFLAG_BOTTOMUP) index = (h - row - 1) * w + col;
        else index = row * w + col;
        if (((row / 8) + (col / 8)) % 2 == 0) {
          if (row >= halfway) buf[index * ps + 3] = 0;
        } else {
          buf[index * ps + 2] = 0;
          if (row < halfway) buf[index * ps + 1] = 0;
        }
      }
    }
  } else {
    memset(buf, 0, w * h * ps);
    for (row = 0; row < h; row++) {
      for (col = 0; col < w; col++) {
        if (flags & TJFLAG_BOTTOMUP) index = (h - row - 1) * w + col;
        else index = row * w + col;
        if (((row / 8) + (col / 8)) % 2 == 0) {
          if (row < halfway) {
            buf[index * ps + roffset] = 255;
            buf[index * ps + goffset] = 255;
            buf[index * ps + boffset] = 255;
          }
        } else {
          buf[index * ps + roffset] = 255;
          if (row >= halfway) buf[index * ps + goffset] = 255;
        }
      }
    }
  }
}